

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_select_node.cpp
# Opt level: O0

void __thiscall
duckdb::Binder::BindModifiers
          (Binder *this,BoundQueryNode *result,idx_t table_index,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *names,vector<duckdb::LogicalType,_true> *sql_types,SelectBindState *bind_state)

{
  ResultModifierType RVar1;
  bool bVar2;
  SelectBindState *bind_state_00;
  pointer pBVar3;
  undefined8 uVar4;
  reference pvVar5;
  SelectBindState *pSVar6;
  const_reference __args;
  reference pBVar7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RCX;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *in_RDX;
  long in_RSI;
  long in_RDI;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *in_R8;
  vector<duckdb::LogicalType,_true> *in_R9;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *expr_4;
  BoundOrderByNode *order_node_1;
  iterator __end4_3;
  iterator __begin4_3;
  vector<duckdb::BoundOrderByNode,_true> *__range4_3;
  templated_unique_single_t expr_3;
  idx_t i;
  OrderByNullType null_order;
  OrderType order_type;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *expr_2;
  BoundOrderByNode *order_node;
  iterator __end4_2;
  iterator __begin4_2;
  vector<duckdb::BoundOrderByNode,_true> *__range4_2;
  bool order_by_all;
  BoundOrderModifier *order;
  BoundLimitModifier *limit;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *expr_1;
  iterator __end4_1;
  iterator __begin4_1;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  *__range4_1;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *expr;
  iterator __end4;
  iterator __begin4;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  *__range4;
  BoundDistinctModifier *distinct;
  unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>
  *bound_mod;
  iterator __end1;
  iterator __begin1;
  vector<duckdb::unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>,_true>
  *__range1;
  string *in_stack_fffffffffffffe08;
  BaseExpression *in_stack_fffffffffffffe10;
  const_reference in_stack_fffffffffffffe18;
  ClientContext *in_stack_fffffffffffffe20;
  SelectBindState *in_stack_fffffffffffffe30;
  SelectBindState *in_stack_fffffffffffffe38;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  *in_stack_fffffffffffffe40;
  idx_t in_stack_fffffffffffffe48;
  BoundResultModifier *in_stack_fffffffffffffe50;
  ColumnBinding *in_stack_fffffffffffffe60;
  allocator *paVar8;
  LogicalType *in_stack_fffffffffffffe68;
  __normal_iterator<duckdb::BoundOrderByNode_*,_std::vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>_>
  local_168;
  vector<duckdb::BoundOrderByNode,_true> *local_160;
  ColumnBinding local_158;
  SelectBindState *local_140;
  OrderByNullType local_132;
  OrderType local_131;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_130;
  reference local_118;
  BoundOrderByNode *local_110;
  __normal_iterator<duckdb::BoundOrderByNode_*,_std::vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>_>
  local_108;
  vector<duckdb::BoundOrderByNode,_true> *local_100;
  byte local_f1;
  BoundOrderModifier *local_f0;
  BoundLimitModifier *local_e8;
  BoundResultModifier *local_e0;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *local_d8;
  __normal_iterator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>_>
  local_d0;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  *local_c8;
  undefined1 local_ba;
  allocator local_b9;
  string local_b8 [48];
  LogicalType local_88;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *local_70;
  __normal_iterator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>_>
  local_68;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  *local_60;
  BoundDistinctModifier *local_58;
  reference local_50;
  unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>
  *local_48;
  __normal_iterator<duckdb::unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>_>_>_>
  local_40;
  
  bind_state_00 = (SelectBindState *)(in_RSI + 0x10);
  local_40._M_current =
       (unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>
        *)::std::
          vector<duckdb::unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>_>_>
          ::begin((vector<duckdb::unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>_>_>
                   *)in_stack_fffffffffffffe08);
  local_48 = (unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>
              *)::std::
                vector<duckdb::unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>_>_>
                ::end((vector<duckdb::unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>_>_>
                       *)in_stack_fffffffffffffe08);
  do {
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<duckdb::unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>_>_>_>
                        *)in_stack_fffffffffffffe10,
                       (__normal_iterator<duckdb::unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>_>_>_>
                        *)in_stack_fffffffffffffe08);
    if (!bVar2) {
      return;
    }
    local_50 = __gnu_cxx::
               __normal_iterator<duckdb::unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>_>_>_>
               ::operator*(&local_40);
    pBVar3 = unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>
             ::operator->((unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>
                           *)in_stack_fffffffffffffe10);
    RVar1 = pBVar3->type;
    if (RVar1 == LIMIT_MODIFIER) {
      unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>
      ::operator->((unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>
                    *)in_stack_fffffffffffffe10);
      local_e8 = BoundResultModifier::Cast<duckdb::BoundLimitModifier>(in_stack_fffffffffffffe50);
      BoundLimitNode::GetExpression(&local_e8->limit_val);
      AssignReturnType((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                        *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
                       in_stack_fffffffffffffe40,
                       (vector<duckdb::LogicalType,_true> *)in_stack_fffffffffffffe38,
                       in_stack_fffffffffffffe30);
      BoundLimitNode::GetExpression(&local_e8->offset_val);
      AssignReturnType((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                        *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
                       in_stack_fffffffffffffe40,
                       (vector<duckdb::LogicalType,_true> *)in_stack_fffffffffffffe38,
                       in_stack_fffffffffffffe30);
    }
    else if (RVar1 == ORDER_MODIFIER) {
      unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>
      ::operator->((unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>
                    *)in_stack_fffffffffffffe10);
      local_f0 = BoundResultModifier::Cast<duckdb::BoundOrderModifier>(in_stack_fffffffffffffe50);
      local_f1 = 0;
      local_100 = &local_f0->orders;
      local_108._M_current =
           (BoundOrderByNode *)
           ::std::vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>::begin
                     ((vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_> *
                      )in_stack_fffffffffffffe08);
      local_110 = (BoundOrderByNode *)
                  ::std::vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                  ::end((vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                         *)in_stack_fffffffffffffe08);
      while (bVar2 = __gnu_cxx::operator!=
                               ((__normal_iterator<duckdb::BoundOrderByNode_*,_std::vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>_>
                                 *)in_stack_fffffffffffffe10,
                                (__normal_iterator<duckdb::BoundOrderByNode_*,_std::vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>_>
                                 *)in_stack_fffffffffffffe08), bVar2) {
        local_118 = __gnu_cxx::
                    __normal_iterator<duckdb::BoundOrderByNode_*,_std::vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>_>
                    ::operator*(&local_108);
        local_130.
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&local_118->expression;
        in_stack_fffffffffffffe40 = &local_130;
        unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::unique_ptr
                  ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   in_stack_fffffffffffffe10,
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   in_stack_fffffffffffffe08);
        FinalizeBindOrderExpression
                  (in_RDX,(idx_t)in_RCX,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                    *)in_R8,in_R9,bind_state_00);
        unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator=
                  ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   in_stack_fffffffffffffe10,
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   in_stack_fffffffffffffe08);
        unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::~unique_ptr
                  ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   0x19db08b);
        unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::~unique_ptr
                  ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   0x19db098);
        bVar2 = ::std::unique_ptr::operator_cast_to_bool
                          ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                            *)0x19db0a5);
        if (!bVar2) {
          local_f1 = 1;
        }
        __gnu_cxx::
        __normal_iterator<duckdb::BoundOrderByNode_*,_std::vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>_>
        ::operator++(&local_108);
      }
      if ((local_f1 & 1) != 0) {
        pvVar5 = vector<duckdb::BoundOrderByNode,_true>::operator[]
                           ((vector<duckdb::BoundOrderByNode,_true> *)in_stack_fffffffffffffe10,
                            (size_type)in_stack_fffffffffffffe08);
        local_131 = pvVar5->type;
        pvVar5 = vector<duckdb::BoundOrderByNode,_true>::operator[]
                           ((vector<duckdb::BoundOrderByNode,_true> *)in_stack_fffffffffffffe10,
                            (size_type)in_stack_fffffffffffffe08);
        local_132 = pvVar5->null_order;
        vector<duckdb::BoundOrderByNode,_true>::clear
                  ((vector<duckdb::BoundOrderByNode,_true> *)0x19db149);
        local_140 = (SelectBindState *)0x0;
        while (in_stack_fffffffffffffe38 = local_140,
              pSVar6 = (SelectBindState *)
                       ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::
                       size(in_R8), in_stack_fffffffffffffe38 < pSVar6) {
          __args = vector<duckdb::LogicalType,_true>::operator[]
                             ((vector<duckdb::LogicalType,_true> *)in_stack_fffffffffffffe10,
                              (size_type)in_stack_fffffffffffffe08);
          ColumnBinding::ColumnBinding(&local_158,(idx_t)in_RDX,(idx_t)local_140);
          make_uniq<duckdb::BoundColumnRefExpression,duckdb::LogicalType_const&,duckdb::ColumnBinding>
                    (in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
          in_stack_fffffffffffffe30 = local_140;
          pSVar6 = (SelectBindState *)
                   ::std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::size(in_RCX);
          if (in_stack_fffffffffffffe30 < pSVar6) {
            in_stack_fffffffffffffe20 =
                 (ClientContext *)
                 unique_ptr<duckdb::BoundColumnRefExpression,_std::default_delete<duckdb::BoundColumnRefExpression>,_true>
                 ::operator->((unique_ptr<duckdb::BoundColumnRefExpression,_std::default_delete<duckdb::BoundColumnRefExpression>,_true>
                               *)in_stack_fffffffffffffe10);
            in_stack_fffffffffffffe18 =
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                               *)in_stack_fffffffffffffe10,(size_type)in_stack_fffffffffffffe08);
            BaseExpression::SetAlias(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
          }
          ::std::vector<duckdb::BoundOrderByNode,std::allocator<duckdb::BoundOrderByNode>>::
          emplace_back<duckdb::OrderType&,duckdb::OrderByNullType&,duckdb::unique_ptr<duckdb::BoundColumnRefExpression,std::default_delete<duckdb::BoundColumnRefExpression>,true>>
                    ((vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_> *)
                     in_stack_fffffffffffffe30,&__args->id_,
                     (OrderByNullType *)in_stack_fffffffffffffe20,
                     (unique_ptr<duckdb::BoundColumnRefExpression,_std::default_delete<duckdb::BoundColumnRefExpression>,_true>
                      *)in_stack_fffffffffffffe18);
          unique_ptr<duckdb::BoundColumnRefExpression,_std::default_delete<duckdb::BoundColumnRefExpression>,_true>
          ::~unique_ptr((unique_ptr<duckdb::BoundColumnRefExpression,_std::default_delete<duckdb::BoundColumnRefExpression>,_true>
                         *)0x19db299);
          local_140 = (SelectBindState *)((long)&(local_140->alias_map)._M_h._M_buckets + 1);
        }
      }
      local_160 = &local_f0->orders;
      local_168._M_current =
           (BoundOrderByNode *)
           ::std::vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>::begin
                     ((vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_> *
                      )in_stack_fffffffffffffe08);
      ::std::vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>::end
                ((vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_> *)
                 in_stack_fffffffffffffe08);
      while (bVar2 = __gnu_cxx::operator!=
                               ((__normal_iterator<duckdb::BoundOrderByNode_*,_std::vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>_>
                                 *)in_stack_fffffffffffffe10,
                                (__normal_iterator<duckdb::BoundOrderByNode_*,_std::vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>_>
                                 *)in_stack_fffffffffffffe08), bVar2) {
        pBVar7 = __gnu_cxx::
                 __normal_iterator<duckdb::BoundOrderByNode_*,_std::vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>_>
                 ::operator*(&local_168);
        in_stack_fffffffffffffe08 = *(string **)(in_RDI + 0x10);
        in_stack_fffffffffffffe10 = (BaseExpression *)&pBVar7->expression;
        unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                  ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   in_stack_fffffffffffffe10);
        ExpressionBinder::PushCollation
                  (in_stack_fffffffffffffe20,
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   in_stack_fffffffffffffe18,(LogicalType *)in_stack_fffffffffffffe10,
                   (CollationType)((ulong)in_stack_fffffffffffffe08 >> 0x20));
        __gnu_cxx::
        __normal_iterator<duckdb::BoundOrderByNode_*,_std::vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>_>
        ::operator++(&local_168);
      }
    }
    else if (RVar1 == DISTINCT_MODIFIER) {
      unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>
      ::operator->((unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>
                    *)in_stack_fffffffffffffe10);
      local_58 = BoundResultModifier::Cast<duckdb::BoundDistinctModifier>(in_stack_fffffffffffffe50)
      ;
      local_60 = &local_58->target_distincts;
      local_68._M_current =
           (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
           ::std::
           vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           ::begin((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                    *)in_stack_fffffffffffffe08);
      local_70 = (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 ::std::
                 vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 ::end((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                        *)in_stack_fffffffffffffe08);
      while (bVar2 = __gnu_cxx::operator!=
                               ((__normal_iterator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>_>
                                 *)in_stack_fffffffffffffe10,
                                (__normal_iterator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>_>
                                 *)in_stack_fffffffffffffe08), bVar2) {
        local_88.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             __gnu_cxx::
             __normal_iterator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>_>
             ::operator*(&local_68);
        in_stack_fffffffffffffe68 = &local_88;
        unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::unique_ptr
                  ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   in_stack_fffffffffffffe10,
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   in_stack_fffffffffffffe08);
        FinalizeBindOrderExpression
                  (in_RDX,(idx_t)in_RCX,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                    *)in_R8,in_R9,bind_state_00);
        unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator=
                  ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   in_stack_fffffffffffffe10,
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   in_stack_fffffffffffffe08);
        unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::~unique_ptr
                  ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   0x19dacdd);
        unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::~unique_ptr
                  ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   0x19dacea);
        bVar2 = ::std::unique_ptr::operator_cast_to_bool
                          ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                            *)0x19dacf7);
        if (!bVar2) {
          local_ba = 1;
          uVar4 = __cxa_allocate_exception(0x10);
          paVar8 = &local_b9;
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string(local_b8,"DISTINCT ON ORDER BY ALL not supported",paVar8);
          InternalException::InternalException
                    ((InternalException *)in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
          local_ba = 0;
          __cxa_throw(uVar4,&InternalException::typeinfo,InternalException::~InternalException);
        }
        __gnu_cxx::
        __normal_iterator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>_>
        ::operator++(&local_68);
      }
      local_c8 = &local_58->target_distincts;
      local_d0._M_current =
           (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
           ::std::
           vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           ::begin((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                    *)in_stack_fffffffffffffe08);
      local_d8 = (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 ::std::
                 vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 ::end((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                        *)in_stack_fffffffffffffe08);
      while (bVar2 = __gnu_cxx::operator!=
                               ((__normal_iterator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>_>
                                 *)in_stack_fffffffffffffe10,
                                (__normal_iterator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>_>
                                 *)in_stack_fffffffffffffe08), bVar2) {
        in_stack_fffffffffffffe50 =
             (BoundResultModifier *)
             __gnu_cxx::
             __normal_iterator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>_>
             ::operator*(&local_d0);
        in_stack_fffffffffffffe48 = *(idx_t *)(in_RDI + 0x10);
        local_e0 = in_stack_fffffffffffffe50;
        unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                  ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   in_stack_fffffffffffffe10);
        ExpressionBinder::PushCollation
                  (in_stack_fffffffffffffe20,
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   in_stack_fffffffffffffe18,(LogicalType *)in_stack_fffffffffffffe10,
                   (CollationType)((ulong)in_stack_fffffffffffffe08 >> 0x20));
        __gnu_cxx::
        __normal_iterator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>_>
        ::operator++(&local_d0);
      }
    }
    __gnu_cxx::
    __normal_iterator<duckdb::unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>_>_>_>
    ::operator++(&local_40);
  } while( true );
}

Assistant:

void Binder::BindModifiers(BoundQueryNode &result, idx_t table_index, const vector<string> &names,
                           const vector<LogicalType> &sql_types, const SelectBindState &bind_state) {
	for (auto &bound_mod : result.modifiers) {
		switch (bound_mod->type) {
		case ResultModifierType::DISTINCT_MODIFIER: {
			auto &distinct = bound_mod->Cast<BoundDistinctModifier>();
			// set types of distinct targets
			for (auto &expr : distinct.target_distincts) {
				expr = FinalizeBindOrderExpression(std::move(expr), table_index, names, sql_types, bind_state);
				if (!expr) {
					throw InternalException("DISTINCT ON ORDER BY ALL not supported");
				}
			}
			for (auto &expr : distinct.target_distincts) {
				ExpressionBinder::PushCollation(context, expr, expr->return_type);
			}
			break;
		}
		case ResultModifierType::LIMIT_MODIFIER: {
			auto &limit = bound_mod->Cast<BoundLimitModifier>();
			AssignReturnType(limit.limit_val.GetExpression(), table_index, names, sql_types, bind_state);
			AssignReturnType(limit.offset_val.GetExpression(), table_index, names, sql_types, bind_state);
			break;
		}
		case ResultModifierType::ORDER_MODIFIER: {
			auto &order = bound_mod->Cast<BoundOrderModifier>();
			bool order_by_all = false;
			for (auto &order_node : order.orders) {
				auto &expr = order_node.expression;
				expr = FinalizeBindOrderExpression(std::move(expr), table_index, names, sql_types, bind_state);
				if (!expr) {
					order_by_all = true;
				}
			}
			if (order_by_all) {
				D_ASSERT(order.orders.size() == 1);
				auto order_type = order.orders[0].type;
				auto null_order = order.orders[0].null_order;
				order.orders.clear();
				for (idx_t i = 0; i < sql_types.size(); i++) {
					auto expr = make_uniq<BoundColumnRefExpression>(sql_types[i], ColumnBinding(table_index, i));
					if (i < names.size()) {
						expr->SetAlias(names[i]);
					}
					order.orders.emplace_back(order_type, null_order, std::move(expr));
				}
			}
			for (auto &order_node : order.orders) {
				auto &expr = order_node.expression;
				ExpressionBinder::PushCollation(context, order_node.expression, expr->return_type);
			}
			break;
		}
		default:
			break;
		}
	}
}